

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86.cpp
# Opt level: O0

void ncnn::binary_op_vector_broadcast_pb_b<ncnn::BinaryOp_x86_functor::binary_op_ratan2>
               (float *ptr,float *ptr1,float *outptr,int w,int elempack)

{
  float fVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  float fVar12;
  float fVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  ulong uVar22;
  ulong uVar23;
  undefined1 auVar17 [16];
  ulong uVar24;
  float fVar25;
  float fVar26;
  ulong uVar27;
  ulong uVar28;
  __m128 special_result;
  __m128 negative_mask_full_x;
  __m128 normal_result;
  __m128 pi_additions;
  __m128 negative_mask_y;
  __m128 negative_mask_x;
  __m128 normal_mode;
  __m128 not_equal_zero_y;
  __m128 not_equal_zero_x;
  __m128 magic_half_pi;
  __m128 magic_pi;
  __m128 magic_negative_zero;
  __m128 magic_zero;
  __m128 output_approx;
  __m128 fourth_power_of_input_approx;
  __m128 square_of_input_approx;
  __m128 input_approx;
  __m128 is_small_input;
  __m128 absolute;
  __m128 negative_mask;
  __m128 magic_a8;
  __m128 magic_a7;
  __m128 magic_a6;
  __m128 magic_a5;
  __m128 magic_a4;
  __m128 magic_a3;
  __m128 magic_a2;
  __m128 magic_a1;
  __m128 magic_a0;
  __m128 magic_half_pi_1;
  __m128 magic_negative_one;
  __m128 magic_one;
  __m128 magic_negative_zero_1;
  int local_d7c;
  float *local_d68;
  undefined1 (*local_d58) [16];
  float local_c08;
  float fStack_c04;
  float fStack_c00;
  float fStack_bfc;
  float local_bf8;
  float fStack_bf4;
  float fStack_bf0;
  float fStack_bec;
  float local_9f8;
  float fStack_9f4;
  float fStack_9f0;
  float fStack_9ec;
  float local_8e8;
  float fStack_8e4;
  float fStack_8e0;
  float fStack_8dc;
  ulong local_728;
  ulong uStack_720;
  float local_718;
  float fStack_714;
  float fStack_710;
  float fStack_70c;
  float local_6a8;
  float fStack_6a4;
  float fStack_6a0;
  float fStack_69c;
  float local_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  __m128 _outp;
  __m128 _p;
  __m128 _b;
  uint uStack_50;
  uint uStack_4c;
  int i;
  int size;
  binary_op_ratan2 op;
  int elempack_local;
  int w_local;
  float *outptr_local;
  float *ptr1_local;
  float *ptr_local;
  
  local_d7c = 0;
  fVar1 = *ptr1;
  local_d68 = outptr;
  local_d58 = (undefined1 (*) [16])ptr;
  for (; local_d7c + 3 < w * elempack; local_d7c = local_d7c + 4) {
    uVar27 = *(ulong *)*local_d58;
    uVar28 = *(ulong *)(*local_d58 + 8);
    auVar3._8_8_ = CONCAT44(fVar1,fVar1);
    auVar3._0_8_ = CONCAT44(fVar1,fVar1);
    local_8e8 = (float)uVar27;
    fStack_8e4 = (float)(uVar27 >> 0x20);
    fStack_8e0 = (float)uVar28;
    fStack_8dc = (float)(uVar28 >> 0x20);
    iVar4 = -(uint)(fVar1 != 0.0);
    iVar6 = -(uint)(fVar1 != 0.0);
    iVar8 = -(uint)(fVar1 != 0.0);
    iVar10 = -(uint)(fVar1 != 0.0);
    uVar14 = CONCAT44(-(uint)(fStack_8e4 != 0.0),-(uint)(local_8e8 != 0.0)) & CONCAT44(iVar6,iVar4);
    uVar22 = CONCAT44(-(uint)(fStack_8dc != 0.0),-(uint)(fStack_8e0 != 0.0)) &
             CONCAT44(iVar10,iVar8);
    uVar15 = CONCAT44(-(uint)(fStack_8e4 < 0.0),-(uint)(local_8e8 < 0.0)) &
             (CONCAT44(-(uint)(fVar1 < 0.0),-(uint)(fVar1 < 0.0)) & 0x8000000080000000 |
             0x40490fdb40490fdb);
    uVar23 = CONCAT44(-(uint)(fStack_8dc < 0.0),-(uint)(fStack_8e0 < 0.0)) &
             (CONCAT44(-(uint)(fVar1 < 0.0),-(uint)(fVar1 < 0.0)) & 0x8000000080000000 |
             0x40490fdb40490fdb);
    auVar17 = divps(auVar3,*local_d58);
    local_728 = auVar17._0_8_;
    uStack_720 = auVar17._8_8_;
    uVar16 = local_728 & 0x7fffffff7fffffff;
    uVar24 = uStack_720 & 0x7fffffff7fffffff;
    local_298 = (float)uVar16;
    fStack_294 = (float)(uVar16 >> 0x20);
    fStack_290 = (float)uVar24;
    fStack_28c = (float)(uVar24 >> 0x20);
    iVar5 = -(uint)(1.0 < local_298);
    iVar7 = -(uint)(1.0 < fStack_294);
    iVar9 = -(uint)(1.0 < fStack_290);
    iVar11 = -(uint)(1.0 < fStack_28c);
    auVar2._8_8_ = CONCAT44(iVar11,iVar9) & 0xbf800000bf800000 | ~CONCAT44(iVar11,iVar9) & uVar24;
    auVar2._0_8_ = CONCAT44(iVar7,iVar5) & 0xbf800000bf800000 | ~CONCAT44(iVar7,iVar5) & uVar16;
    auVar17._8_8_ = CONCAT44(iVar11,iVar9) & uVar24 | ~CONCAT44(iVar11,iVar9) & 0x3f8000003f800000;
    auVar17._0_8_ = CONCAT44(iVar7,iVar5) & uVar16 | ~CONCAT44(iVar7,iVar5) & 0x3f8000003f800000;
    auVar17 = divps(auVar2,auVar17);
    local_6a8 = auVar17._0_4_;
    fStack_6a4 = auVar17._4_4_;
    fStack_6a0 = auVar17._8_4_;
    fStack_69c = auVar17._12_4_;
    fVar12 = local_6a8 * local_6a8;
    fVar18 = fStack_6a4 * fStack_6a4;
    fVar20 = fStack_6a0 * fStack_6a0;
    fVar25 = fStack_69c * fStack_69c;
    fVar13 = fVar12 * fVar12;
    fVar19 = fVar18 * fVar18;
    fVar21 = fVar20 * fVar20;
    fVar26 = fVar25 * fVar25;
    uVar16 = CONCAT44(iVar7,iVar5) & 0x3fc90fdb3fc90fdb;
    uVar24 = CONCAT44(iVar11,iVar9) & 0x3fc90fdb3fc90fdb;
    local_718 = (float)uVar16;
    fStack_714 = (float)(uVar16 >> 0x20);
    fStack_710 = (float)uVar24;
    fStack_70c = (float)(uVar24 >> 0x20);
    uVar16 = CONCAT44((fVar18 * (fVar19 * (fVar19 * (fVar19 * -0.01606863 + -0.07504295) +
                                          -0.14203644) + -0.33333072) +
                      fVar19 * (fVar19 * (fVar19 * (fVar19 * 0.0028498897 + 0.04269152) + 0.10640934
                                         ) + 0.1999262) + 1.0) * fStack_6a4 + fStack_714,
                      (fVar12 * (fVar13 * (fVar13 * (fVar13 * -0.01606863 + -0.07504295) +
                                          -0.14203644) + -0.33333072) +
                      fVar13 * (fVar13 * (fVar13 * (fVar13 * 0.0028498897 + 0.04269152) + 0.10640934
                                         ) + 0.1999262) + 1.0) * local_6a8 + local_718) |
             local_728 & 0x8000000080000000;
    uVar24 = CONCAT44((fVar25 * (fVar26 * (fVar26 * (fVar26 * -0.01606863 + -0.07504295) +
                                          -0.14203644) + -0.33333072) +
                      fVar26 * (fVar26 * (fVar26 * (fVar26 * 0.0028498897 + 0.04269152) + 0.10640934
                                         ) + 0.1999262) + 1.0) * fStack_69c + fStack_70c,
                      (fVar20 * (fVar21 * (fVar21 * (fVar21 * -0.01606863 + -0.07504295) +
                                          -0.14203644) + -0.33333072) +
                      fVar21 * (fVar21 * (fVar21 * (fVar21 * 0.0028498897 + 0.04269152) + 0.10640934
                                         ) + 0.1999262) + 1.0) * fStack_6a0 + fStack_710) |
             uStack_720 & 0x8000000080000000;
    local_bf8 = (float)uVar16;
    fStack_bf4 = (float)(uVar16 >> 0x20);
    fStack_bf0 = (float)uVar24;
    fStack_bec = (float)(uVar24 >> 0x20);
    local_c08 = (float)uVar15;
    fStack_c04 = (float)(uVar15 >> 0x20);
    fStack_c00 = (float)uVar23;
    fStack_bfc = (float)(uVar23 >> 0x20);
    uVar27 = uVar27 & 0x8000000080000000 | 0x40490fdb40490fdb;
    uVar28 = uVar28 & 0x8000000080000000 | 0x40490fdb40490fdb;
    local_9f8 = (float)uVar27;
    fStack_9f4 = (float)(uVar27 >> 0x20);
    fStack_9f0 = (float)uVar28;
    fStack_9ec = (float)(uVar28 >> 0x20);
    uVar27 = CONCAT44(iVar6,iVar4) &
             (CONCAT44(fVar1,fVar1) & 0x8000000080000000 | 0x3fc90fdb3fc90fdb) |
             ~CONCAT44(iVar6,iVar4) &
             CONCAT44(-(uint)(fStack_9f4 < 0.0),-(uint)(local_9f8 < 0.0)) & 0x40490fdb40490fdb;
    uVar28 = CONCAT44(iVar10,iVar8) &
             (CONCAT44(fVar1,fVar1) & 0x8000000080000000 | 0x3fc90fdb3fc90fdb) |
             ~CONCAT44(iVar10,iVar8) &
             CONCAT44(-(uint)(fStack_9ec < 0.0),-(uint)(fStack_9f0 < 0.0)) & 0x40490fdb40490fdb;
    _b[2] = (float)uVar14;
    _b[3] = (float)(uVar14 >> 0x20);
    uStack_50 = (uint)uVar22;
    uStack_4c = (uint)(uVar22 >> 0x20);
    _p[2] = (float)uVar27;
    _p[3] = (float)(uVar27 >> 0x20);
    _b[0] = (float)uVar28;
    _b[1] = (float)(uVar28 >> 0x20);
    *(ulong *)local_d68 =
         uVar14 & CONCAT44(fStack_bf4 + fStack_c04,local_bf8 + local_c08) |
         CONCAT44(((uint)_b[3] ^ 0xffffffff) & (uint)_p[3],((uint)_b[2] ^ 0xffffffff) & (uint)_p[2])
    ;
    *(ulong *)(local_d68 + 2) =
         uVar22 & CONCAT44(fStack_bec + fStack_bfc,fStack_bf0 + fStack_c00) |
         CONCAT44((uStack_4c ^ 0xffffffff) & (uint)_b[1],(uStack_50 ^ 0xffffffff) & (uint)_b[0]);
    local_d58 = local_d58 + 1;
    local_d68 = local_d68 + 4;
  }
  return;
}

Assistant:

static void binary_op_vector_broadcast_pb_b(const float* ptr, const float* ptr1, float* outptr, int w, int elempack)
{
    const Op op;

    const int size = w * elempack;

    int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
    __m512 _b_avx512 = _mm512_set1_ps(*ptr1);
    for (; i + 15 < size; i += 16)
    {
        __m512 _p = _mm512_loadu_ps(ptr);
        __m512 _outp = op.func_pack16(_p, _b_avx512);
        _mm512_storeu_ps(outptr, _outp);
        ptr += 16;
        outptr += 16;
    }
#endif // __AVX512F__
    __m256 _b_avx = _mm256_set1_ps(*ptr1);
    for (; i + 7 < size; i += 8)
    {
        __m256 _p = _mm256_loadu_ps(ptr);
        __m256 _outp = op.func_pack8(_p, _b_avx);
        _mm256_storeu_ps(outptr, _outp);
        ptr += 8;
        outptr += 8;
    }
#endif // __AVX__
    __m128 _b = _mm_set1_ps(*ptr1);
    for (; i + 3 < size; i += 4)
    {
        __m128 _p = _mm_loadu_ps(ptr);
        __m128 _outp = op.func_pack4(_p, _b);
        _mm_storeu_ps(outptr, _outp);
        ptr += 4;
        outptr += 4;
    }
#endif // __SSE2__
}